

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O0

void __thiscall
Script_SetStackData_size_error_Test::Script_SetStackData_size_error_Test
          (Script_SetStackData_size_error_Test *this)

{
  Script_SetStackData_size_error_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Script_SetStackData_size_error_Test_0066ce28;
  return;
}

Assistant:

TEST(Script, SetStackData_size_error) {
  try {
    std::vector<uint8_t> bytes(10, 0x1);
    bytes[0] = 0x4e;
    Script script(bytes);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "buffer is incorrect size.");
    return;
  }
  ASSERT_TRUE(false);
}